

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_avx2.c
# Opt level: O0

void load_shuffle_masks_for_2x2_convolve(__m256i *output_mask,__m256i *weight_mask)

{
  __m256i *weight_mask_local;
  __m256i *output_mask_local;
  
  (*output_mask)[0] = 0x100000000;
  (*output_mask)[1] = 0x500000004;
  (*output_mask)[2] = 0x300000002;
  (*output_mask)[3] = 0x700000006;
  (*weight_mask)[0] = 0x100000000;
  (*weight_mask)[1] = 0x100000000;
  (*weight_mask)[2] = 0x100000000;
  (*weight_mask)[3] = 0x100000000;
  weight_mask[1][0] = 0x300000002;
  weight_mask[1][1] = 0x300000002;
  weight_mask[1][2] = 0x300000002;
  weight_mask[1][3] = 0x300000002;
  return;
}

Assistant:

static inline void load_shuffle_masks_for_2x2_convolve(__m256i *output_mask,
                                                       __m256i *weight_mask) {
  // Load shuffle buffer needed to sort the output.
  *output_mask =
      _mm256_load_si256((const __m256i *)shuffle_output_layer_1_and_2);

  // Load shuffle buffers needed for weight.
  weight_mask[0] =
      _mm256_load_si256((const __m256i *)shuffle_weight_layer_1_and_2[0]);
  weight_mask[1] =
      _mm256_load_si256((const __m256i *)shuffle_weight_layer_1_and_2[1]);
}